

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::NoShaders::Run(NoShaders *this)

{
  uint uVar1;
  GLuint program;
  long lVar2;
  long error;
  long local_60;
  CallLogWrapper *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = &(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateProgram(local_58);
  local_60 = 0;
  lVar2 = 0;
  do {
    uVar1 = *(uint *)((long)&glcts::(anonymous_namespace)::PIQBase::interfaces + lVar2);
    (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
              (this,(ulong)program,(ulong)uVar1,0x92f5,0,&local_60);
    if (lVar2 != 0x18) {
      (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
                (this,(ulong)program,(ulong)uVar1,0x92f6,0,&local_60);
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x20);
  lVar2 = 0;
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)program,0x92c0,0x92f7,0,&local_60);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)program,0x92e6,0x92f7,0,&local_60);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)program,0x92e2,0x92f7,0,&local_60);
  do {
    if (lVar2 != 0x18) {
      uVar1 = *(uint *)((long)&glcts::(anonymous_namespace)::PIQBase::interfaces + lVar2);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,0x1af8059);
      (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xe])
                (this,(ulong)program,(ulong)uVar1,(string *)local_50,0xffffffff,&local_60);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x20);
  glu::CallLogWrapper::glDeleteProgram(local_58,program);
  return local_60;
}

Assistant:

virtual long Run()
	{
		const GLuint program = glCreateProgram();

		long error = NO_ERROR;
		int  size  = sizeof(PIQBase::interfaces) / sizeof(PIQBase::interfaces[0]);

		for (int i = 0; i < size; ++i)
		{
			VerifyGetProgramInterfaceiv(program, PIQBase::interfaces[i], GL_ACTIVE_RESOURCES, 0, error);
			if (PIQBase::interfaces[i] == GL_ATOMIC_COUNTER_BUFFER)
				continue;
			VerifyGetProgramInterfaceiv(program, PIQBase::interfaces[i], GL_MAX_NAME_LENGTH, 0, error);
		}
		VerifyGetProgramInterfaceiv(program, GL_ATOMIC_COUNTER_BUFFER, GL_MAX_NUM_ACTIVE_VARIABLES, 0, error);
		VerifyGetProgramInterfaceiv(program, GL_SHADER_STORAGE_BLOCK, GL_MAX_NUM_ACTIVE_VARIABLES, 0, error);
		VerifyGetProgramInterfaceiv(program, GL_UNIFORM_BLOCK, GL_MAX_NUM_ACTIVE_VARIABLES, 0, error);

		for (int i = 0; i < size; ++i)
		{
			if (PIQBase::interfaces[i] == GL_ATOMIC_COUNTER_BUFFER)
				continue;
			VerifyGetProgramResourceIndex(program, PIQBase::interfaces[i], "", GL_INVALID_INDEX, error);
		}

		// can't test GetProgramResourceLocation* here since program has to be linked
		// can't test GetProgramResourceiv, need valid index

		glDeleteProgram(program);
		return error;
	}